

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

char * getTerritoryIsoName(char *territoryISO,Territory territory,int useShortName)

{
  char *__s;
  char *pcVar1;
  char *hyphen;
  char *alphaCode;
  int useShortName_local;
  Territory territory_local;
  char *territoryISO_local;
  
  if ((territory < TERRITORY_VAT) || (TERRITORY_AAA < territory)) {
    *territoryISO = '\0';
  }
  else {
    __s = ISO3166_ALPHA[territory + ~_TERRITORY_MIN];
    pcVar1 = strchr(__s,0x2d);
    if ((useShortName == 0) || (pcVar1 == (char *)0x0)) {
      strcpy(territoryISO,__s);
    }
    else {
      strcpy(territoryISO,pcVar1 + 1);
    }
  }
  return territoryISO;
}

Assistant:

char *getTerritoryIsoName(char *territoryISO, enum Territory territory, int useShortName) {
    ASSERT(territoryISO);
    ASSERT(useShortName == 0 || useShortName == 1);
    if (territory <= _TERRITORY_MIN || territory >= _TERRITORY_MAX) {
        *territoryISO = 0;
    } else {
        const char *alphaCode = ISO3166_ALPHA[INDEX_OF_TERRITORY(territory)];
        const char *hyphen = strchr(alphaCode, '-');
        if (useShortName && hyphen != NULL) {
            strcpy(territoryISO, hyphen + 1);
        } else {
            strcpy(territoryISO, alphaCode);
        }
    }
    return territoryISO;
}